

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O1

bool __thiscall soplex::IdxSet::isConsistent(IdxSet *this)

{
  return true;
}

Assistant:

bool IdxSet::isConsistent() const
{
#ifdef ENABLE_CONSISTENCY_CHECKS
   int i, j;

   if(len > 0 && idx == nullptr)
      return SPX_MSG_INCONSISTENT("IdxSet");

   for(i = 0; i < size(); ++i)
   {
      if(index(i) < 0)
         return SPX_MSG_INCONSISTENT("IdxSet");

      for(j = 0; j < i; j++)
         if(index(i) == index(j))
            return SPX_MSG_INCONSISTENT("IdxSet");
   }

#endif

   return true;
}